

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_ebmol_extrap_vel_to_faces.cpp
# Opt level: O2

void EBMOL::ExtrapVelToFaces
               (MultiFab *a_vel,MultiFab *a_umac,MultiFab *a_vmac,MultiFab *a_wmac,Geometry *a_geom,
               Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *h_bcrec,BCRec *d_bcrec)

{
  Box *pBVar1;
  EBCellFlagFab *this;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  double *pdVar7;
  Long LVar8;
  double *pdVar9;
  Long LVar10;
  FabType FVar11;
  EBFArrayBoxFactory *this_00;
  int *piVar12;
  FabArray<amrex::FArrayBox> *pFVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  void *pvVar23;
  long lVar24;
  int j;
  int iVar25;
  int iVar26;
  Box local_3dc;
  Box local_3c0;
  Box local_3a4;
  MultiCutFab *local_388;
  EBFArrayBoxFactory *local_380;
  FabArray<amrex::FArrayBox> *local_378;
  FabArray<amrex::EBCellFlagFab> *local_370;
  FabArray<amrex::FArrayBox> *local_368;
  FabArray<amrex::FArrayBox> *local_360;
  FabArray<amrex::FArrayBox> *local_358;
  Array<const_MultiCutFab_*,_3> local_350;
  Array4<const_amrex::EBCellFlag> local_338;
  Array4<double> local_2f8;
  Array4<double> local_2b8;
  Array4<double> local_278;
  Box result;
  Box local_1ec;
  MFIter mfi;
  Array4<const_double> local_170;
  Array4<const_double> vfrac;
  Array4<const_double> local_f0;
  Array4<const_double> local_b0;
  Array4<const_double> local_70;
  
  local_368 = &a_umac->super_FabArray<amrex::FArrayBox>;
  local_360 = &a_vmac->super_FabArray<amrex::FArrayBox>;
  local_358 = &a_wmac->super_FabArray<amrex::FArrayBox>;
  this_00 = (EBFArrayBoxFactory *)
            __dynamic_cast((a_vel->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
                           super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                           .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                           _M_head_impl,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                           &amrex::EBFArrayBoxFactory::typeinfo,0);
  if (this_00 != (EBFArrayBoxFactory *)0x0) {
    local_370 = amrex::EBFArrayBoxFactory::getMultiEBCellFlagFab(this_00);
    amrex::EBFArrayBoxFactory::getFaceCent(&local_350,this_00);
    local_380 = this_00;
    local_388 = amrex::EBFArrayBoxFactory::getCentroid(this_00);
    amrex::MFIter::MFIter(&mfi,(FabArrayBase *)a_vel,true);
    local_378 = &a_vel->super_FabArray<amrex::FArrayBox>;
    while (pFVar13 = local_378, mfi.currentIndex < mfi.endIndex) {
      amrex::MFIter::nodaltilebox(&local_3a4,&mfi,0);
      amrex::MFIter::nodaltilebox(&local_3c0,&mfi,1);
      amrex::MFIter::nodaltilebox(&local_3dc,&mfi,2);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_278,local_368,&mfi);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_2b8,local_360,&mfi);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_2f8,local_358,&mfi);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_170,pFVar13,&mfi);
      amrex::MFIter::tilebox(&local_1ec,&mfi);
      piVar12 = &mfi.currentIndex;
      if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar12 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start + mfi.currentIndex;
      }
      this = (local_370->m_fabs_v).
             super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>.
             _M_impl.super__Vector_impl_data._M_start[*piVar12];
      local_338.p = (this->super_BaseFab<amrex::EBCellFlag>).dptr;
      local_338.ncomp = (this->super_BaseFab<amrex::EBCellFlag>).nvar;
      pBVar1 = &(this->super_BaseFab<amrex::EBCellFlag>).domain;
      local_338.begin.z = (this->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[2];
      local_338.begin.x = (pBVar1->smallend).vect[0];
      local_338.begin.y = (pBVar1->smallend).vect[1];
      lVar21 = (long)(this->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[1] + 1;
      lVar22 = (long)(this->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[0];
      lVar17 = (long)(this->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[2] + 1;
      local_338.jstride = (lVar22 - (pBVar1->smallend).vect[0]) + 1;
      local_338.kstride =
           (lVar21 - (this->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[1]) *
           local_338.jstride;
      local_338.nstride = (lVar17 - local_338.begin.z) * local_338.kstride;
      local_338.end._0_8_ = lVar22 + 1U & 0xffffffff | lVar21 << 0x20;
      local_338.end.z = (int)lVar17;
      result.bigend.vect[2] = local_1ec.bigend.vect[2];
      result.btype.itype = local_1ec.btype.itype;
      result.smallend.vect[0] = local_1ec.smallend.vect[0];
      result.smallend.vect[1] = local_1ec.smallend.vect[1];
      result.smallend.vect[2] = local_1ec.smallend.vect[2] + -2;
      result.bigend.vect[0] = local_1ec.bigend.vect[0] + 2;
      result.smallend.vect[1] = result.smallend.vect[1] + -2;
      result.smallend.vect[0] = result.smallend.vect[0] + -2;
      result.bigend.vect[1] = local_1ec.bigend.vect[1] + 2;
      result.bigend.vect[2] = result.bigend.vect[2] + 2;
      FVar11 = amrex::EBCellFlagFab::getType(this,&result);
      LVar8 = local_278.kstride;
      pdVar7 = local_278.p;
      iVar3 = local_3a4.bigend.vect[1];
      iVar2 = local_3a4.bigend.vect[0];
      iVar26 = local_3a4.smallend.vect[1];
      iVar15 = local_3a4.smallend.vect[0];
      if (FVar11 == singlevalued) {
        amrex::MultiCutFab::const_array((Array4<const_double> *)&result,local_350._M_elems[0],&mfi);
        amrex::MultiCutFab::const_array(&local_70,local_350._M_elems[1],&mfi);
        amrex::MultiCutFab::const_array(&local_b0,local_350._M_elems[2],&mfi);
        amrex::MultiCutFab::const_array(&local_f0,local_388,&mfi);
        pFVar13 = &amrex::EBFArrayBoxFactory::getVolFrac(local_380)->
                   super_FabArray<amrex::FArrayBox>;
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&vfrac,pFVar13,&mfi);
        ExtrapVelToFacesBox(&local_3a4,&local_3c0,&local_3dc,&local_278,&local_2b8,&local_2f8,
                            &local_170,&local_338,(Array4<const_double> *)&result,&local_70,
                            &local_b0,&local_f0,&vfrac,a_geom,h_bcrec,d_bcrec);
      }
      else if (FVar11 == covered) {
        lVar17 = (long)local_278.begin.x;
        lVar21 = (long)local_278.begin.y;
        lVar18 = (long)local_3a4.smallend.vect[0];
        lVar19 = (long)local_3a4.smallend.vect[1];
        lVar22 = (long)local_3a4.bigend.vect[2];
        uVar16 = local_3a4.bigend.vect[0] - local_3a4.smallend.vect[0];
        lVar24 = local_278.jstride * 8;
        iVar14 = local_3a4.smallend.vect[2] - local_278.begin.z;
        for (lVar20 = (long)local_3a4.smallend.vect[2]; LVar10 = local_2b8.kstride,
            pdVar9 = local_2b8.p, iVar6 = local_3c0.bigend.vect[1], iVar5 = local_3c0.bigend.vect[0]
            , iVar4 = local_3c0.smallend.vect[1], iVar25 = local_3c0.smallend.vect[0],
            lVar20 <= lVar22; lVar20 = lVar20 + 1) {
          pvVar23 = (void *)((long)pdVar7 +
                            (iVar14 * LVar8 + lVar18) * 8 + (lVar19 - lVar21) * lVar24 + lVar17 * -8
                            );
          for (iVar25 = iVar26; iVar25 <= iVar3; iVar25 = iVar25 + 1) {
            if (iVar15 <= iVar2) {
              memset(pvVar23,0,(ulong)uVar16 * 8 + 8);
            }
            pvVar23 = (void *)((long)pvVar23 + lVar24);
          }
          iVar14 = iVar14 + 1;
        }
        lVar17 = (long)local_2b8.begin.x;
        lVar21 = (long)local_2b8.begin.y;
        lVar18 = (long)local_3c0.smallend.vect[0];
        lVar19 = (long)local_3c0.smallend.vect[1];
        lVar22 = (long)local_3c0.bigend.vect[2];
        uVar16 = local_3c0.bigend.vect[0] - local_3c0.smallend.vect[0];
        lVar24 = local_2b8.jstride * 8;
        iVar15 = local_3c0.smallend.vect[2] - local_2b8.begin.z;
        for (lVar20 = (long)local_3c0.smallend.vect[2]; LVar8 = local_2f8.kstride,
            pdVar7 = local_2f8.p, iVar14 = local_3dc.bigend.vect[1],
            iVar3 = local_3dc.bigend.vect[0], iVar2 = local_3dc.smallend.vect[1],
            iVar26 = local_3dc.smallend.vect[0], lVar20 <= lVar22; lVar20 = lVar20 + 1) {
          pvVar23 = (void *)((long)pdVar9 +
                            (iVar15 * LVar10 + lVar18) * 8 +
                            (lVar19 - lVar21) * lVar24 + lVar17 * -8);
          for (iVar26 = iVar4; iVar26 <= iVar6; iVar26 = iVar26 + 1) {
            if (iVar25 <= iVar5) {
              memset(pvVar23,0,(ulong)uVar16 * 8 + 8);
            }
            pvVar23 = (void *)((long)pvVar23 + lVar24);
          }
          iVar15 = iVar15 + 1;
        }
        lVar17 = (long)local_2f8.begin.x;
        lVar21 = (long)local_2f8.begin.y;
        lVar18 = (long)local_3dc.smallend.vect[0];
        lVar19 = (long)local_3dc.smallend.vect[1];
        lVar22 = (long)local_3dc.bigend.vect[2];
        uVar16 = local_3dc.bigend.vect[0] - local_3dc.smallend.vect[0];
        lVar24 = local_2f8.jstride * 8;
        iVar15 = local_3dc.smallend.vect[2] - local_2f8.begin.z;
        for (lVar20 = (long)local_3dc.smallend.vect[2]; lVar20 <= lVar22; lVar20 = lVar20 + 1) {
          pvVar23 = (void *)((long)pdVar7 +
                            (iVar15 * LVar8 + lVar18) * 8 + (lVar19 - lVar21) * lVar24 + lVar17 * -8
                            );
          for (iVar25 = iVar2; iVar25 <= iVar14; iVar25 = iVar25 + 1) {
            if (iVar26 <= iVar3) {
              memset(pvVar23,0,(ulong)uVar16 * 8 + 8);
            }
            pvVar23 = (void *)((long)pvVar23 + lVar24);
          }
          iVar15 = iVar15 + 1;
        }
      }
      else {
        MOL::ExtrapVelToFacesBox
                  (&local_3a4,&local_3c0,&local_3dc,&local_278,&local_2b8,&local_2f8,&local_170,
                   a_geom,h_bcrec,d_bcrec);
      }
      amrex::MFIter::operator++(&mfi);
    }
    amrex::MFIter::~MFIter(&mfi);
    return;
  }
  __cxa_bad_cast();
}

Assistant:

void
EBMOL::ExtrapVelToFaces ( const MultiFab&  a_vel,
                          AMREX_D_DECL( MultiFab& a_umac,
                                        MultiFab& a_vmac,
                                        MultiFab& a_wmac ),
                          const Geometry&  a_geom,
                          const Vector<BCRec>& h_bcrec,
                          BCRec  const* d_bcrec)
{
    BL_PROFILE("EBMOL::ExtrapVelToFaces");

#ifdef AMREX_USE_EB
    AMREX_ASSERT(a_vel.hasEBFabFactory());
    auto const& fact  = dynamic_cast<EBFArrayBoxFactory const&>(a_vel.Factory());
    auto const& flags = fact.getMultiEBCellFlagFab();
    auto const& fcent = fact.getFaceCent();
    auto const& ccent = fact.getCentroid();
#endif

#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    {
        for (MFIter mfi(a_vel, TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            AMREX_D_TERM( Box const& ubx = mfi.nodaltilebox(0);,
                          Box const& vbx = mfi.nodaltilebox(1);,
                          Box const& wbx = mfi.nodaltilebox(2););

            AMREX_D_TERM( Array4<Real> const& u = a_umac.array(mfi);,
                          Array4<Real> const& v = a_vmac.array(mfi);,
                          Array4<Real> const& w = a_wmac.array(mfi););

            Array4<Real const> const& vcc = a_vel.const_array(mfi);

#ifdef AMREX_USE_EB
            Box const& bx = mfi.tilebox();
            EBCellFlagFab const& flagfab = flags[mfi];
            Array4<EBCellFlag const> const& flagarr = flagfab.const_array();
            auto const typ = flagfab.getType(amrex::grow(bx,2));
            if (typ == FabType::covered)
            {
                amrex::ParallelFor(ubx, [u]
                AMREX_GPU_DEVICE (int i, int j, int k) noexcept { u(i,j,k) = 0.0; });
                amrex::ParallelFor(vbx, [v]
                AMREX_GPU_DEVICE (int i, int j, int k) noexcept { v(i,j,k) = 0.0; });
#if (AMREX_SPACEDIM==3)
                amrex::ParallelFor(wbx, [w]
                AMREX_GPU_DEVICE (int i, int j, int k) noexcept { w(i,j,k) = 0.0; });
#endif
            }
            else if (typ == FabType::singlevalued)
            {
                AMREX_D_TERM( Array4<Real const> const& fcx = fcent[0]->const_array(mfi);,
                              Array4<Real const> const& fcy = fcent[1]->const_array(mfi);,
                              Array4<Real const> const& fcz = fcent[2]->const_array(mfi););

                Array4<Real const> const& ccc = ccent.const_array(mfi);
                auto vfrac = fact.getVolFrac().const_array(mfi);

                EBMOL::ExtrapVelToFacesBox(AMREX_D_DECL(ubx,vbx,wbx),
                                           AMREX_D_DECL(u,v,w),vcc,flagarr,
                                           AMREX_D_DECL(fcx,fcy,fcz),ccc, vfrac,
                                           a_geom, h_bcrec, d_bcrec);
            }
            else
#endif
            {
                MOL::ExtrapVelToFacesBox(AMREX_D_DECL(ubx,vbx,wbx),
                                         AMREX_D_DECL(u,v,w),
                                         vcc,a_geom,h_bcrec, d_bcrec);
            }
        }
    }

}